

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

void __thiscall stk::FileWrite::closeSndFile(FileWrite *this)

{
  int local_18;
  int local_14;
  SINT32 bytes;
  int bytesPerSample;
  FileWrite *this_local;
  
  local_14 = 1;
  if (this->dataType_ == 2) {
    local_14 = 2;
  }
  else if (this->dataType_ == 4) {
    local_14 = 3;
  }
  else if (this->dataType_ == 8) {
    local_14 = 4;
  }
  else if (this->dataType_ == 0x10) {
    local_14 = 4;
  }
  else if (this->dataType_ == 0x20) {
    local_14 = 8;
  }
  local_18 = (int)this->frameCounter_ * local_14 * this->channels_;
  _bytes = this;
  Stk::swap32((uchar *)&local_18);
  fseek((FILE *)this->fd_,8,0);
  fwrite(&local_18,4,1,(FILE *)this->fd_);
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeSndFile( void )
{
  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  else if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  SINT32 bytes = (SINT32) (frameCounter_ * bytesPerSample * channels_);
#ifdef __LITTLE_ENDIAN__
  swap32 ((unsigned char *)&bytes);
#endif
  fseek(fd_, 8, SEEK_SET); // jump to data size
  fwrite(&bytes, 4, 1, fd_);
  fclose(fd_);
}